

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::EntryFrom(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_1d317480_for_newObjectCreationFunction newObjectCreationFunction;
  anon_class_24_3_1d317480_for_newObjectCreationFunction newObjectCreationFunction_00;
  anon_class_40_5_9a3df42a implicitCall;
  anon_class_40_5_9a3df42a implicitCall_00;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  CallFlags e;
  BOOL BVar6;
  uint uVar7;
  uint32 uVar8;
  ScriptContext *pSVar9;
  ThreadContext *pTVar10;
  Var *values;
  undefined4 *puVar11;
  Var pvVar12;
  RecyclableObject *pRVar13;
  TempGuestArenaAllocatorObject *this;
  ArenaAllocator *alloc;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  Type *ppvVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypedArrayBase *local_378;
  TypedArrayBase *local_330;
  TypedArrayBase *local_2d8;
  Var kVar_1;
  Var kValue_1;
  JavascriptArray *pJStack_1b8;
  uint32 k_1;
  JavascriptArray *newArr_1;
  TypedArrayBase *newTypedArrayBase_1;
  undefined4 uStack_19c;
  JavascriptArray *local_190;
  JavascriptArray *itemsArray;
  TypedArrayBase *itemsTypedArrayBase;
  uint32 len_1;
  Var lenValue;
  Var kVar;
  Var kValue;
  JavascriptArray *pJStack_130;
  uint32 k;
  JavascriptArray *newArr;
  TypedArrayBase *newTypedArrayBase;
  undefined4 uStack_114;
  uint32 len;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *tempList;
  ArenaAllocator *tempAlloc;
  TempGuestArenaAllocatorObject *tempGuesttempAlloc;
  RecyclableObject *iterator;
  Var newObj;
  Var mapFnThisArg;
  RecyclableObject *mapFn;
  RecyclableObject *pRStack_c0;
  bool mapping;
  RecyclableObject *items;
  RecyclableObject *pRStack_b0;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  RecyclableObject *local_98;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar9 = RecyclableObject::GetScriptContext(function);
  pTVar10 = ScriptContext::GetThreadContext(pSVar9);
  pSVar9 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar10,0xc00,pSVar9,(PVOID)0x0);
  iVar5 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar5);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x55a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar9 = RecyclableObject::GetScriptContext(function);
  __tag.entry.next = (Entry *)ScriptContext::GetLibrary(pSVar9);
  local_98 = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,(CallInfo)function_local,
             L"[TypedArray].from",&stack0x00000000);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x560,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar3 = Js::JavascriptOperators::IsConstructor(pvVar12);
    if (bVar3) {
      pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pRStack_b0 = VarTo<Js::RecyclableObject>(pvVar12);
      items._7_1_ = JavascriptLibrary::IsTypedArrayConstructor(pRStack_b0,pSVar9);
      pRStack_c0 = (RecyclableObject *)0x0;
      if (1 < ((uint)scriptContext & 0xffffff)) {
        pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,1);
        BVar6 = JavascriptConversion::ToObject(pvVar12,pSVar9,&stack0xffffffffffffff40);
        if (BVar6 != 0) {
          bVar3 = false;
          mapFnThisArg = (Var)0x0;
          newObj = (Var)0x0;
          if (2 < ((uint)scriptContext & 0xffffff)) {
            pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,2);
            bVar3 = JavascriptConversion::IsCallable(pvVar12);
            if (!bVar3) {
              JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ec34,L"[TypedArray].from");
            }
            pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,2);
            mapFnThisArg = VarTo<Js::RecyclableObject>(pvVar12);
            if (((uint)scriptContext & 0xffffff) < 4) {
              newObj = JavascriptLibraryBase::GetUndefined
                                 ((JavascriptLibraryBase *)__tag.entry.next);
            }
            else {
              newObj = Arguments::operator[]((Arguments *)&scriptContext,3);
            }
            bVar3 = true;
          }
          pRVar13 = Js::JavascriptOperators::GetIterator(pRStack_c0,pSVar9,true);
          if (pRVar13 == (RecyclableObject *)0x0) {
            pvVar12 = Js::JavascriptOperators::OP_GetLength(pRStack_c0,pSVar9);
            uVar8 = JavascriptConversion::ToUInt32(pvVar12,pSVar9);
            pRVar13 = pRStack_c0;
            bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(pRStack_c0);
            if (bVar4) {
              local_330 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar13);
            }
            else {
              local_330 = (TypedArrayBase *)0x0;
            }
            local_190 = (JavascriptArray *)0x0;
            if (local_330 == (TypedArrayBase *)0x0) {
              local_190 = Js::JavascriptArray::TryVarToNonES5Array(pRStack_c0);
            }
            pRVar13 = pRStack_b0;
            bVar2 = items._7_1_;
            pTVar10 = ScriptContext::GetThreadContext(pSVar9);
            newObjectCreationFunction_00._12_4_ = uStack_19c;
            newObjectCreationFunction_00.len = uVar8;
            newObjectCreationFunction_00.constructor = pRStack_b0;
            newObjectCreationFunction_00.scriptContext = pSVar9;
            iterator = (RecyclableObject *)
                       Js::JavascriptOperators::
                       NewObjectCreationHelper_ReentrancySafe<Js::TypedArrayBase::EntryFrom(Js::RecyclableObject*,Js::CallInfo,___)::__2>
                                 (pRVar13,(bool)(bVar2 & 1),pTVar10,newObjectCreationFunction_00);
            callInfo_local = (CallInfo)iterator;
            bVar4 = VarIs<Js::TypedArrayBase>(iterator);
            if (bVar4) {
              local_378 = UnsafeVarTo<Js::TypedArrayBase>((Var)callInfo_local);
            }
            else {
              local_378 = (TypedArrayBase *)0x0;
            }
            pJStack_1b8 = (JavascriptArray *)0x0;
            if (local_378 == (TypedArrayBase *)0x0) {
              pJStack_1b8 = Js::JavascriptArray::TryVarToNonES5Array(iterator);
            }
            for (kValue_1._4_4_ = 0; kValue_1._4_4_ < uVar8; kValue_1._4_4_ = kValue_1._4_4_ + 1) {
              if (local_330 == (TypedArrayBase *)0x0) {
                if (local_190 == (JavascriptArray *)0x0) {
                  kVar_1 = Js::JavascriptOperators::OP_GetElementI_UInt32
                                     (pRStack_c0,kValue_1._4_4_,pSVar9);
                }
                else {
                  iVar5 = (*(local_190->super_ArrayObject).super_DynamicObject.
                            super_RecyclableObject.super_FinalizableObject.
                            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                                    (local_190,(ulong)kValue_1._4_4_);
                  kVar_1 = (Var)CONCAT44(extraout_var_00,iVar5);
                }
              }
              else {
                iVar5 = (*(local_330->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject
                          .super_RecyclableObject.super_FinalizableObject.
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                                  (local_330,(ulong)kValue_1._4_4_);
                kVar_1 = (Var)CONCAT44(extraout_var,iVar5);
              }
              if (bVar3) {
                if (mapFnThisArg == (Var)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                              ,0x5ff,"(mapFn != nullptr)","mapFn != nullptr");
                  if (!bVar4) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 0;
                }
                if (newObj == (Var)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                              ,0x600,"(mapFnThisArg != nullptr)",
                                              "mapFnThisArg != nullptr");
                  if (!bVar4) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 0;
                }
                pvVar12 = JavascriptNumber::ToVar(kValue_1._4_4_,pSVar9);
                pTVar10 = ScriptContext::GetThreadContext(pSVar9);
                implicitCall_00.mapFn = (RecyclableObject *)mapFnThisArg;
                implicitCall_00.scriptContext = pSVar9;
                implicitCall_00.mapFnThisArg = newObj;
                implicitCall_00.kValue = kVar_1;
                implicitCall_00.kVar = pvVar12;
                kVar_1 = ThreadContext::
                         ExecuteImplicitCall<Js::TypedArrayBase::EntryFrom(Js::RecyclableObject*,Js::CallInfo,___)::__3>
                                   (pTVar10,(RecyclableObject *)mapFnThisArg,ImplicitCall_Accessor,
                                    implicitCall_00);
              }
              if (local_378 == (TypedArrayBase *)0x0) {
                if (pJStack_1b8 == (JavascriptArray *)0x0) {
                  Js::JavascriptOperators::OP_SetElementI_UInt32
                            (iterator,kValue_1._4_4_,kVar_1,pSVar9,
                             PropertyOperation_ThrowIfNotExtensible);
                }
                else {
                  (*(pJStack_1b8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(pJStack_1b8,(ulong)kValue_1._4_4_,kVar_1,4);
                }
              }
              else {
                (*(local_378->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x70])(local_378,(ulong)kValue_1._4_4_,kVar_1);
              }
            }
          }
          else {
            this = ScriptContext::GetTemporaryGuestAllocator(pSVar9,L"Runtime");
            alloc = TempArenaAllocatorWrapper<true>::GetAllocator(this);
            this_00 = IteratorToList(pRVar13,pSVar9,alloc);
            uVar7 = JsUtil::ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                              (&this_00->
                                super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>)
            ;
            pRVar13 = pRStack_b0;
            bVar2 = items._7_1_;
            pTVar10 = ScriptContext::GetThreadContext(pSVar9);
            newObjectCreationFunction._12_4_ = uStack_114;
            newObjectCreationFunction.len = uVar7;
            newObjectCreationFunction.constructor = pRStack_b0;
            newObjectCreationFunction.scriptContext = pSVar9;
            iterator = (RecyclableObject *)
                       Js::JavascriptOperators::
                       NewObjectCreationHelper_ReentrancySafe<Js::TypedArrayBase::EntryFrom(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                                 (pRVar13,(bool)(bVar2 & 1),pTVar10,newObjectCreationFunction);
            bVar4 = VarIs<Js::TypedArrayBase>(iterator);
            if (bVar4) {
              local_2d8 = UnsafeVarTo<Js::TypedArrayBase>(iterator);
            }
            else {
              local_2d8 = (TypedArrayBase *)0x0;
            }
            pJStack_130 = (JavascriptArray *)0x0;
            if (local_2d8 == (TypedArrayBase *)0x0) {
              pJStack_130 = Js::JavascriptArray::TryVarToNonES5Array(iterator);
            }
            for (kValue._4_4_ = 0; kValue._4_4_ < uVar7; kValue._4_4_ = kValue._4_4_ + 1) {
              ppvVar14 = JsUtil::
                         List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         ::Item(this_00,kValue._4_4_);
              kVar = *ppvVar14;
              if (bVar3) {
                if (mapFnThisArg == (Var)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                              ,0x5b4,"(mapFn != nullptr)","mapFn != nullptr");
                  if (!bVar4) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 0;
                }
                if (newObj == (Var)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                              ,0x5b5,"(mapFnThisArg != nullptr)",
                                              "mapFnThisArg != nullptr");
                  if (!bVar4) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar11 = 0;
                }
                pvVar12 = JavascriptNumber::ToVar(kValue._4_4_,pSVar9);
                pTVar10 = ScriptContext::GetThreadContext(pSVar9);
                implicitCall.mapFn = (RecyclableObject *)mapFnThisArg;
                implicitCall.scriptContext = pSVar9;
                implicitCall.mapFnThisArg = newObj;
                implicitCall.kValue = kVar;
                implicitCall.kVar = pvVar12;
                kVar = ThreadContext::
                       ExecuteImplicitCall<Js::TypedArrayBase::EntryFrom(Js::RecyclableObject*,Js::CallInfo,___)::__1>
                                 (pTVar10,(RecyclableObject *)mapFnThisArg,ImplicitCall_Accessor,
                                  implicitCall);
              }
              if (local_2d8 == (TypedArrayBase *)0x0) {
                if (pJStack_130 == (JavascriptArray *)0x0) {
                  Js::JavascriptOperators::OP_SetElementI_UInt32
                            (iterator,kValue._4_4_,kVar,pSVar9,
                             PropertyOperation_ThrowIfNotExtensible);
                }
                else {
                  (*(pJStack_130->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(pJStack_130,(ulong)kValue._4_4_,kVar,4);
                }
              }
              else {
                (*(local_2d8->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x70])(local_2d8,(ulong)kValue._4_4_,kVar);
              }
            }
            if (this != (TempGuestArenaAllocatorObject *)0x0) {
              ScriptContext::ReleaseTemporaryGuestAllocator(pSVar9,this);
            }
          }
          AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                    ((AutoTagNativeLibraryEntry *)local_90);
          return iterator;
        }
      }
      JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ec36,L"[TypedArray].from");
    }
  }
  JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ec40,L"[TypedArray].from");
}

Assistant:

Var TypedArrayBase::EntryFrom(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].from"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_from);

        if (args.Info.Count < 1 || !JavascriptOperators::IsConstructor(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].from"));
        }

        RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
        bool isDefaultConstructor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);
        RecyclableObject* items = nullptr;

        if (args.Info.Count < 2 || !JavascriptConversion::ToObject(args[1], scriptContext, &items))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("[TypedArray].from"));
        }

        bool mapping = false;
        RecyclableObject* mapFn = nullptr;
        Var mapFnThisArg = nullptr;

        if (args.Info.Count >= 3)
        {
            if (!JavascriptConversion::IsCallable(args[2]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].from"));
            }

            mapFn = VarTo<RecyclableObject>(args[2]);

            if (args.Info.Count >= 4)
            {
                mapFnThisArg = args[3];
            }
            else
            {
                mapFnThisArg = library->GetUndefined();
            }

            mapping = true;
        }

        Var newObj;
        RecyclableObject* iterator = JavascriptOperators::GetIterator(items, scriptContext, true /* optional */);

        if (iterator != nullptr)
        {
            DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

            ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
            {
                // Create a temporary list to hold the items returned from the iterator.
                // We will then iterate over this list and append those items into the object we will return.
                // We have to collect the items into this temporary list because we need to call the
                // new object constructor with a length of items and we don't know what length will be
                // until we iterate across all the items.
                // Consider: Could be possible to fast-path this in order to avoid creating the temporary list
                //       for types we know such as TypedArray. We know the length of a TypedArray but we still
                //       have to be careful in case there is a proxy which could return anything from [[Get]]
                //       or the built-in @@iterator has been replaced.
                JsUtil::List<Var, ArenaAllocator>* tempList = IteratorToList(iterator, scriptContext, tempAlloc);

                uint32 len = tempList->Count();
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    return TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                });

                TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
                JavascriptArray* newArr = nullptr;

                if (!newTypedArrayBase)
                {
                    newArr = JavascriptArray::TryVarToNonES5Array(newObj);
                }

                for (uint32 k = 0; k < len; k++)
                {
                    Var kValue = tempList->Item(k);

                    if (mapping)
                    {
                        Assert(mapFn != nullptr);
                        Assert(mapFnThisArg != nullptr);

                        Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                        kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                        {
                            return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                        });
                    }

                    // We're likely to have constructed a new TypedArray, but the constructor could return any object
                    if (newTypedArrayBase)
                    {
                        newTypedArrayBase->DirectSetItem(k, kValue);
                    }
                    else if (newArr)
                    {
                        newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                    else
                    {
                        JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                }
            }
            RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);
        }
        else
        {
            Var lenValue = JavascriptOperators::OP_GetLength(items, scriptContext);
            uint32 len = JavascriptConversion::ToUInt32(lenValue, scriptContext);

            TypedArrayBase* itemsTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(items);
            JavascriptArray* itemsArray = nullptr;

            if (!itemsTypedArrayBase)
            {
                itemsArray = JavascriptArray::TryVarToNonES5Array(items);
            }

            newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
            });

            TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            JavascriptArray* newArr = nullptr;

            if (!newTypedArrayBase)
            {
                newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            }

            for (uint32 k = 0; k < len; k++)
            {
                Var kValue;

                // The items source could be anything, but we already know if it's a TypedArray or Array
                if (itemsTypedArrayBase)
                {
                    kValue = itemsTypedArrayBase->DirectGetItem(k);
                }
                else if (itemsArray)
                {
                    kValue = itemsArray->DirectGetItem(k);
                }
                else
                {
                    kValue = JavascriptOperators::OP_GetElementI_UInt32(items, k, scriptContext);
                }

                if (mapping)
                {
                    Assert(mapFn != nullptr);
                    Assert(mapFnThisArg != nullptr);

                    Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                    kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                    });
                }

                // If constructor built a TypedArray (likely) or Array (maybe likely) we can do a more direct set operation
                if (newTypedArrayBase)
                {
                    newTypedArrayBase->DirectSetItem(k, kValue);
                }
                else if (newArr)
                {
                    newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }

        return newObj;
    }